

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O0

void __thiscall
TTD::SnapshotExtractor::ExtractHandlerIfNeeded
          (SnapshotExtractor *this,DynamicTypeHandler *handler,ThreadContext *threadContext)

{
  SnapHandler *threadContext_00;
  ThreadContext *this_00;
  bool bVar1;
  SnapHandler *handler_00;
  SlabAllocator *alloc;
  SnapHandler *local_28;
  SnapHandler *sHandler;
  ThreadContext *threadContext_local;
  DynamicTypeHandler *handler_local;
  SnapshotExtractor *this_local;
  
  sHandler = (SnapHandler *)threadContext;
  threadContext_local = (ThreadContext *)handler;
  handler_local = (DynamicTypeHandler *)this;
  bVar1 = MarkTable::IsMarked(&this->m_marks,handler);
  if (bVar1) {
    handler_00 = SnapShot::GetNextAvailableHandlerEntry(this->m_pendingSnap);
    this_00 = threadContext_local;
    threadContext_00 = sHandler;
    local_28 = handler_00;
    alloc = SnapShot::GetSnapshotSlabAllocator(this->m_pendingSnap);
    Js::DynamicTypeHandler::ExtractSnapHandler
              ((DynamicTypeHandler *)this_00,handler_00,(ThreadContext *)threadContext_00,alloc);
    TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::AddItem
              (&this->m_idToHandlerMap,local_28->HandlerId,&local_28);
    MarkTable::ClearMark(&this->m_marks,threadContext_local);
  }
  return;
}

Assistant:

void SnapshotExtractor::ExtractHandlerIfNeeded(Js::DynamicTypeHandler* handler, ThreadContext* threadContext)
    {
        if(this->m_marks.IsMarked(handler))
        {
            NSSnapType::SnapHandler* sHandler = this->m_pendingSnap->GetNextAvailableHandlerEntry();
            handler->ExtractSnapHandler(sHandler, threadContext, this->m_pendingSnap->GetSnapshotSlabAllocator());

            this->m_idToHandlerMap.AddItem(sHandler->HandlerId, sHandler);
            this->m_marks.ClearMark(handler);
        }
    }